

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O2

void QSettings::setPath(Format format,Scope scope,QString *path)

{
  QHash<int,_(anonymous_namespace)::Path> *this;
  unique_lock<QBasicMutex> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a8;
  int local_8c;
  QStringBuilder<const_QString_&,_QChar> local_88;
  Path local_78;
  unique_lock<QBasicMutex> local_58;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (unique_lock<QBasicMutex> *)local_48;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::unique_lock<QBasicMutex>::unique_lock(this_00,&settingsGlobalMutex);
  this = (QHash<int,_(anonymous_namespace)::Path> *)
         QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pathHashFunc>_>::
         operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pathHashFunc>_>
                     *)this_00);
  if ((*(long *)this == 0) || (*(long *)(*(long *)this + 8) == 0)) {
    local_58._M_device = (mutex_type *)local_48._0_8_;
    local_58._M_owns = local_48[8];
    local_48._0_8_ = (mutex_type *)0x0;
    local_48._8_8_ = local_48._8_8_ & 0xffffffffffffff00;
    initDefaultPaths((unique_lock<QBasicMutex> *)&local_78);
    std::unique_lock<QBasicMutex>::operator=
              ((unique_lock<QBasicMutex> *)local_48,(unique_lock<QBasicMutex> *)&local_78);
    std::unique_lock<QBasicMutex>::~unique_lock((unique_lock<QBasicMutex> *)&local_78);
    std::unique_lock<QBasicMutex>::~unique_lock(&local_58);
  }
  local_8c = (uint)(scope == SystemScope) + format * 2;
  local_88.b.ucs = L'/';
  local_88.a = path;
  QStringBuilder<const_QString_&,_QChar>::convertTo<QString>((QString *)&local_a8,&local_88);
  local_78.path.d.d = local_a8.d;
  local_78.path.d.ptr = local_a8.ptr;
  local_78.path.d.size = local_a8.size;
  if (local_a8.d != (Data *)0x0) {
    LOCK();
    ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78.userDefined = true;
  QHash<int,_(anonymous_namespace)::Path>::insert(this,&local_8c,&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  std::unique_lock<QBasicMutex>::~unique_lock((unique_lock<QBasicMutex> *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSettings::setPath(Format format, Scope scope, const QString &path)
{
    auto locker = qt_unique_lock(settingsGlobalMutex);
    PathHash *pathHash = pathHashFunc();
    if (pathHash->isEmpty())
        locker = initDefaultPaths(std::move(locker));
    pathHash->insert(pathHashKey(format, scope), Path(path + QDir::separator(), true));
}